

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkCase
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeCase *pnode,Context context)

{
  bool bVar1;
  ResultType local_21;
  ResultType result;
  Context context_local;
  ParseNodeCase *pnode_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkFirstChild
                       ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                        pnode->pnodeExpr,context);
  bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                    (&this->super_WalkerPolicyTest,local_21);
  if (bVar1) {
    local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNode
                         ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                          (ParseNode *)pnode,context);
    bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                      (&this->super_WalkerPolicyTest,local_21);
    if (bVar1) {
      local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkSecondChild
                           ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                            (ParseNode *)pnode->pnodeBody,context);
    }
  }
  return local_21;
}

Assistant:

ResultType WalkCase(ParseNodeCase *pnode, Context context)
    {
        ResultType result = WalkFirstChild(pnode->pnodeExpr, context);
        if (ContinueWalk(result))
        {
            result = WalkNode(pnode, context);
            if (ContinueWalk(result)) result = WalkSecondChild(pnode->pnodeBody, context);
        }
        return result;
    }